

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

VertexProcess ON_SubDToBrepParameters::VertexProcessFromUnsigned(uint vertex_process_as_unsigned)

{
  VertexProcess local_9;
  uint vertex_process_as_unsigned_local;
  
  switch(vertex_process_as_unsigned) {
  case 0:
    local_9 = None;
    break;
  case 1:
    local_9 = LocalG1;
    break;
  case 2:
    local_9 = LocalG2;
    break;
  case 3:
    local_9 = LocalG1x;
    break;
  case 4:
    local_9 = LocalG1xx;
    break;
  default:
    ON_SubDIncrementErrorCount();
    local_9 = None;
  }
  return local_9;
}

Assistant:

ON_SubDToBrepParameters::VertexProcess ON_SubDToBrepParameters::VertexProcessFromUnsigned(
  unsigned int vertex_process_as_unsigned
)
{
  switch (vertex_process_as_unsigned)
  {
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDToBrepParameters::VertexProcess::None);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDToBrepParameters::VertexProcess::LocalG1);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDToBrepParameters::VertexProcess::LocalG2);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDToBrepParameters::VertexProcess::LocalG1x);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDToBrepParameters::VertexProcess::LocalG1xx);
  }
  return ON_SUBD_RETURN_ERROR(ON_SubDToBrepParameters::VertexProcess::None);
}